

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

Au_Ntk_t * Au_NtkParseCBlif(char *pFileName)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int nFanouts;
  uint uVar5;
  FILE *__stream;
  char *__ptr;
  Vec_Int_t *p;
  int *piVar6;
  Au_Man_t *pMan;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  Au_Ntk_t *pAVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  bool bVar17;
  long lVar18;
  ulong *puVar19;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (Au_Ntk_t *)0x0;
  }
  __ptr = Extra_FileRead((FILE *)__stream);
  fclose(__stream);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p->pArray = piVar6;
  lVar18 = 0;
  Vec_IntPush(p,0);
  do {
    if (__ptr[lVar18] == '\n') {
      __ptr[lVar18] = '\0';
      Vec_IntPush(p,(int)lVar18 + 1);
    }
    else if (__ptr[lVar18] == '\0') break;
    lVar18 = lVar18 + 1;
  } while( true );
  pMan = Au_ManAlloc(pFileName);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_00->pArray = piVar6;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  piVar6 = (int *)malloc(4000);
  p_01->pArray = piVar6;
  if (0 < p->nSize) {
    uVar13 = 0;
    pAVar10 = (Au_Ntk_t *)0x0;
    do {
      iVar15 = p->pArray[uVar13];
      pcVar7 = strtok(__ptr + iVar15," \t\r");
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '#')) {
        if (*pcVar7 == '.') {
          p_01->nSize = 0;
          iVar4 = strcmp(pcVar7,".and");
          if (iVar4 == 0) {
            bVar3 = true;
            do {
              bVar17 = bVar3;
              pcVar7 = strtok((char *)0x0," \t\r");
              uVar5 = atoi(pcVar7);
              uVar12 = (int)uVar5 >> 1;
              if (((int)uVar12 < 0) || (p_00->nSize <= (int)uVar12)) goto LAB_0085c357;
              Vec_IntPush(p_01,(uVar5 & 1) + p_00->pArray[uVar12] * 2);
              bVar3 = false;
            } while (bVar17);
            iVar15 = 1;
          }
          else {
            iVar4 = strcmp(pcVar7,".xor");
            if (iVar4 == 0) {
              bVar3 = true;
              do {
                bVar17 = bVar3;
                pcVar7 = strtok((char *)0x0," \t\r");
                uVar5 = atoi(pcVar7);
                uVar12 = (int)uVar5 >> 1;
                if (((int)uVar12 < 0) || (p_00->nSize <= (int)uVar12)) goto LAB_0085c357;
                Vec_IntPush(p_01,(uVar5 & 1) + p_00->pArray[uVar12] * 2);
                bVar3 = false;
              } while (bVar17);
              iVar15 = 2;
            }
            else {
              iVar4 = strcmp(pcVar7,".mux");
              if (iVar4 != 0) {
                iVar4 = strcmp(pcVar7,".subckt");
                if (iVar4 == 0) {
                  iVar15 = 0;
                  pcVar7 = strtok((char *)0x0," \t\r");
                  pcVar8 = strtok((char *)0x0," \t\r");
                  iVar4 = atoi(pcVar8);
                  pcVar8 = strtok((char *)0x0," \t\r");
                  nFanouts = atoi(pcVar8);
                  pcVar8 = strtok((char *)0x0," \t\r");
                  if (pcVar8 != (char *)0x0) {
                    do {
                      if (*pcVar8 == '#') break;
                      Au_NtkParseCBlifNum(p_01,pcVar8,p_00);
                      pcVar8 = strtok((char *)0x0," \t\r");
                    } while (pcVar8 != (char *)0x0);
                    iVar15 = p_01->nSize;
                  }
                  if (iVar15 != iVar4) {
                    __assert_fail("Vec_IntSize(vFanins) == nInputs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                  ,0x41b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                  }
                  uVar5 = Au_NtkCreateBox(pAVar10,p_01,nFanouts,(int)pcVar7 - (int)__ptr);
                  pvVar1 = (pAVar10->vPages).pArray[(int)uVar5 >> 0xc];
                  uVar9 = (ulong)((uVar5 & 0xfff) << 4);
                  uVar14 = *(ulong *)((long)pvVar1 + uVar9);
                  if ((uVar14 & 0x700000000) != 0x600000000) {
LAB_0085c338:
                    __assert_fail("Au_ObjIsBox(p)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                  ,0xb5,"int Au_BoxFanoutNum(Au_Obj_t *)");
                  }
                  puVar19 = (ulong *)((long)pvVar1 + uVar9);
                  iVar15 = 0;
                  while (iVar15 < *(int *)((long)puVar19 + (uVar14 >> 0x23) * 4 + 8)) {
                    Vec_IntPush(p_00,*(int *)((long)puVar19 +
                                             (ulong)(iVar15 + (uint)(uVar14 >> 0x23) + 1) * 4 + 8));
                    uVar14 = *puVar19;
                    iVar15 = iVar15 + 1;
                    if ((uVar14 & 0x700000000) != 0x600000000) goto LAB_0085c338;
                  }
                }
                else {
                  iVar4 = strcmp(pcVar7,".model");
                  if (iVar4 == 0) {
                    pcVar7 = strtok((char *)0x0," \t\r");
                    pAVar10 = Au_NtkAlloc(pMan,pcVar7);
                    iVar15 = Au_NtkAllocObj(pAVar10,0,1);
                    p_00->nSize = 0;
                    Vec_IntPush(p_00,iVar15);
                  }
                  else {
                    iVar4 = strcmp(pcVar7,".inputs");
                    if (iVar4 == 0) {
                      pcVar7 = strtok((char *)0x0," \t\r");
                      iVar15 = atoi(pcVar7);
                      if (0 < iVar15) {
                        do {
                          iVar4 = Au_NtkAllocObj(pAVar10,0,2);
                          Vec_IntPush(p_00,iVar4);
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                    }
                    else {
                      iVar4 = strcmp(pcVar7,".outputs");
                      if (iVar4 == 0) {
                        iVar15 = 0;
                        pcVar7 = strtok((char *)0x0," \t\r");
                        iVar4 = atoi(pcVar7);
                        pcVar7 = strtok((char *)0x0," \t\r");
                        if (pcVar7 != (char *)0x0) {
                          do {
                            if (*pcVar7 == '#') break;
                            Au_NtkParseCBlifNum(p_01,pcVar7,p_00);
                            pcVar7 = strtok((char *)0x0," \t\r");
                          } while (pcVar7 != (char *)0x0);
                          iVar15 = p_01->nSize;
                        }
                        if (iVar15 != iVar4) {
                          __assert_fail("Vec_IntSize(vFanins) == nOutputs",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                                        ,0x43b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                        }
                        if (0 < iVar4) {
                          lVar18 = 0;
                          do {
                            Au_NtkCreatePo(pAVar10,p_01->pArray[lVar18]);
                            lVar18 = lVar18 + 1;
                          } while (lVar18 < p_01->nSize);
                        }
                      }
                      else {
                        iVar4 = strcmp(pcVar7,".end");
                        if (iVar4 != 0) {
                          pcVar7 = "Unknown directive in line %d: \"%s\".\n";
                          goto LAB_0085bd11;
                        }
                      }
                    }
                  }
                }
                goto LAB_0085c06a;
              }
              iVar15 = 3;
              do {
                pcVar7 = strtok((char *)0x0," \t\r");
                uVar5 = atoi(pcVar7);
                uVar12 = (int)uVar5 >> 1;
                if (((int)uVar12 < 0) || (p_00->nSize <= (int)uVar12)) goto LAB_0085c357;
                Vec_IntPush(p_01,(uVar5 & 1) + p_00->pArray[uVar12] * 2);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
              iVar15 = 3;
            }
          }
          iVar15 = Au_NtkCreateNode(pAVar10,p_01,iVar15);
          Vec_IntPush(p_00,iVar15);
        }
        else {
          pcVar7 = "Cannot read directive in line %d: \"%s\".\n";
LAB_0085bd11:
          printf(pcVar7,uVar13 & 0xffffffff,__ptr + iVar15);
        }
      }
LAB_0085c06a:
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)p->nSize);
    piVar6 = p_01->pArray;
  }
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  free(p_01);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  iVar15 = (pMan->vNtks).nSize;
  if (1 < iVar15) {
    lVar18 = 1;
    do {
      lVar16 = (long)iVar15;
      if (lVar16 <= lVar18) goto LAB_0085c395;
      pvVar1 = (pMan->vNtks).pArray[lVar18];
      iVar4 = *(int *)((long)pvVar1 + 0x3c);
      if (0 < iVar4) {
        lVar16 = 0;
        do {
          lVar11 = (long)iVar4;
          if (lVar11 <= lVar16) {
LAB_0085c357:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar5 = *(uint *)(*(long *)((long)pvVar1 + 0x40) + lVar16 * 4);
          lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x78) + (long)((int)uVar5 >> 0xc) * 8);
          uVar14 = (ulong)((uVar5 & 0xfff) << 4);
          uVar13 = *(ulong *)(lVar2 + uVar14);
          if ((uVar13 & 0x700000000) == 0x600000000) {
            puVar19 = (ulong *)(lVar2 + uVar14);
            uVar5 = Au_ManFindNtk(pMan,__ptr + ((uint)uVar13 & 0x3fffffff));
            uVar13 = *puVar19;
            uVar14 = uVar13 & 0xffffffffc0000000 | (ulong)(uVar5 & 0x3fffffff);
            *puVar19 = uVar14;
            if ((uVar5 & 0x3fffffff) == 0) {
              __assert_fail("pBox->Func > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                            ,0x44a,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
            }
            if ((uVar13 & 0x700000000) != 0x600000000) goto LAB_0085c338;
            iVar15 = 0;
            while (iVar15 < *(int *)((long)puVar19 + (uVar14 >> 0x23) * 4 + 8)) {
              iVar4 = (uint)(uVar14 >> 0x23) + iVar15;
              iVar15 = iVar15 + 1;
              uVar5 = *(uint *)((long)puVar19 + (ulong)(iVar4 + 1) * 4 + 8);
              lVar11 = *(long *)(*(long *)(*(long *)((long)puVar19 - (ulong)((uint)puVar19 & 0x3ff))
                                          + 0x78) + (long)((int)uVar5 >> 0xc) * 8);
              uVar13 = (ulong)((uVar5 & 0xfff) << 4);
              *(ulong *)(lVar11 + uVar13) =
                   *(ulong *)(lVar11 + uVar13) & 0xffffffffc0000000 |
                   (ulong)((uint)uVar14 & 0x3fffffff);
              uVar14 = *puVar19;
              if ((uVar14 & 0x700000000) != 0x600000000) goto LAB_0085c338;
            }
            iVar4 = *(int *)((long)pvVar1 + 0x3c);
            lVar11 = (long)iVar4;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < lVar11);
        iVar15 = (pMan->vNtks).nSize;
        lVar16 = (long)iVar15;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < lVar16);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
    iVar15 = (pMan->vNtks).nSize;
  }
  if (1 < iVar15) {
    pAVar10 = (Au_Ntk_t *)(pMan->vNtks).pArray[1];
    Au_ManReorderModels(pMan,pAVar10);
    return pAVar10;
  }
LAB_0085c395:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Au_Ntk_t * Au_NtkParseCBlif( char * pFileName )
{
    FILE * pFile;
    Au_Man_t * pMan;
    Au_Ntk_t * pRoot = NULL;
    Au_Obj_t * pBox, * pFan;
    char * pBuffer, * pCur;
    Vec_Int_t * vLines, * vNum2Obj, * vFanins;
    int i, k, j, Id, nInputs, nOutputs;
    int Line, Num, Func;
    // read the file
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    pBuffer = Extra_FileRead( pFile );
    fclose( pFile );
    // split into lines
    vLines = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLines, 0 );
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            *pCur = 0;
            Vec_IntPush( vLines, pCur - pBuffer + 1 );
        }
    // start the manager
    pMan = Au_ManAlloc( pFileName );
    // parse the lines
    vNum2Obj = Vec_IntAlloc( 1000 );
    vFanins = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vLines, Line, i )
    {
        pCur = strtok( pBuffer + Line, " \t\r" );
        if ( pCur == NULL || *pCur == '#' )
            continue;
        if ( *pCur != '.' )
        {
            printf( "Cannot read directive in line %d: \"%s\".\n", i, pBuffer + Line );
            continue;
        }
        Vec_IntClear( vFanins );
        if ( !strcmp(pCur, ".and") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 1 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".xor") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 2 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".mux") )
        {
            for ( k = 0; k < 3; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 3 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".subckt") )
        {
            pCur = strtok( NULL, " \t\r" );
            Func = pCur - pBuffer;
            pCur = strtok( NULL, " \t\r" );
            nInputs = atoi( pCur );
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break;
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nInputs );
            Id = Au_NtkCreateBox( pRoot, vFanins, nOutputs, Func );
            pBox = Au_NtkObj( pRoot, Id );
            Au_BoxForEachFanoutId( pBox, Num, k )
                Vec_IntPush( vNum2Obj, Num );
        }
        else if ( !strcmp(pCur, ".model") )
        {
            pCur  = strtok( NULL, " \t\r" );
            pRoot = Au_NtkAlloc( pMan, pCur );
            Id    = Au_NtkCreateConst0( pRoot );
            Vec_IntClear( vNum2Obj );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".inputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            Num  = atoi( pCur );
            for ( k = 0; k < Num; k++ )
                Vec_IntPush( vNum2Obj, Au_NtkCreatePi(pRoot) );
        }
        else if ( !strcmp(pCur, ".outputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break; 
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nOutputs );
            Vec_IntForEachEntry( vFanins, Num, k )
                Au_NtkCreatePo( pRoot, Num );
        }
        else if ( strcmp(pCur, ".end") )
            printf( "Unknown directive in line %d: \"%s\".\n", i, pBuffer + Line );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vNum2Obj );
    Vec_IntFree( vLines );
    // set pointers to models
    Au_ManForEachNtk( pMan, pRoot, i )
        Au_NtkForEachBox( pRoot, pBox, k )
        {
            pBox->Func = Au_ManFindNtk( pMan, pBuffer + pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    ABC_FREE( pBuffer );
    // order models in topological order
    pRoot = Au_ManNtkRoot( pMan );
    Au_ManReorderModels( pMan, pRoot );
    return pRoot;
}